

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool mkvparser::Match(IMkvReader *pReader,longlong *pos,unsigned_long expected_id,uchar **buf,
                     size_t *buflen)

{
  int iVar1;
  unsigned_long uVar2;
  unsigned_long_long element_size;
  uchar *puVar3;
  long lVar4;
  longlong available;
  long len;
  longlong total;
  
  if (pReader == (IMkvReader *)0x0) {
    return false;
  }
  if (*pos < 0) {
    return false;
  }
  total = 0;
  iVar1 = (*pReader->_vptr_IMkvReader[1])();
  if ((-1 < iVar1) && ((total < 0 || (-1 < total)))) {
    len = 0;
    uVar2 = ReadID(pReader,*pos,&len);
    if (-1 < (long)uVar2) {
      if (uVar2 != expected_id) {
        return false;
      }
      if (len < -*pos) {
        return false;
      }
      lVar4 = len + *pos;
      *pos = lVar4;
      element_size = ReadUInt(pReader,lVar4,&len);
      if (((0xfffffffffffffff7 < len - 9U && -1 < (long)element_size) && (-*pos <= len)) &&
         (lVar4 = *pos + len, -1 < lVar4)) {
        *pos = lVar4;
        if (element_size == 0x7fffffffffffffff) {
          return false;
        }
        if ((long)(lVar4 + element_size) < 0) {
          return false;
        }
        if (0 < (long)(lVar4 + element_size)) {
          return false;
        }
        puVar3 = SafeArrayAlloc<unsigned_char>(1,element_size);
        *buf = puVar3;
        if ((puVar3 != (uchar *)0x0) &&
           (iVar1 = (**pReader->_vptr_IMkvReader)(pReader,*pos,element_size,puVar3), iVar1 == 0)) {
          *buflen = element_size;
          *pos = *pos + element_size;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Match(IMkvReader* pReader, long long& pos, unsigned long expected_id,
           unsigned char*& buf, size_t& buflen) {
  if (!pReader || pos < 0)
    return false;

  long long total = 0;
  long long available = 0;

  long status = pReader->Length(&total, &available);
  if (status < 0 || (total >= 0 && available > total))
    return false;

  long len = 0;
  const long long id = ReadID(pReader, pos, len);
  if (id < 0 || (available - pos) > len)
    return false;

  if (static_cast<unsigned long>(id) != expected_id)
    return false;

  pos += len;  // consume id

  const long long size = ReadUInt(pReader, pos, len);
  if (size < 0 || len <= 0 || len > 8 || (available - pos) > len)
    return false;

  unsigned long long rollover_check =
      static_cast<unsigned long long>(pos) + len;
  if (rollover_check > LLONG_MAX)
    return false;

  pos += len;  // consume length of size of payload

  rollover_check = static_cast<unsigned long long>(pos) + size;
  if (rollover_check > LLONG_MAX)
    return false;

  if ((pos + size) > available)
    return false;

  if (size >= LONG_MAX)
    return false;

  const long buflen_ = static_cast<long>(size);

  buf = SafeArrayAlloc<unsigned char>(1, buflen_);
  if (!buf)
    return false;

  status = pReader->Read(pos, buflen_, buf);
  if (status != 0)
    return false;

  buflen = buflen_;

  pos += size;  // consume size of payload
  return true;
}